

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O2

void wallet::WalletDescriptor::
     SerializationOps<DataStream,wallet::WalletDescriptor_const,ActionSerialize>
               (WalletDescriptor *obj,DataStream *s)

{
  long in_FS_OFFSET;
  string descriptor_str;
  anon_class_8_1_53f8d39f local_40;
  string local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_40.descriptor_str = &local_38;
  SerializationOps<DataStream,_const_wallet::WalletDescriptor,_ActionSerialize>::
  anon_class_8_1_53f8d39f::operator()(&local_40,s,obj);
  SerializeMany<DataStream,std::__cxx11::string,unsigned_long,int,int,int>
            (s,&local_38,&obj->creation_time,&obj->next_index,&obj->range_start,&obj->range_end);
  std::__cxx11::string::~string((string *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SERIALIZE_METHODS(WalletDescriptor, obj)
    {
        std::string descriptor_str;
        SER_WRITE(obj, descriptor_str = obj.descriptor->ToString());
        READWRITE(descriptor_str, obj.creation_time, obj.next_index, obj.range_start, obj.range_end);
        SER_READ(obj, obj.DeserializeDescriptor(descriptor_str));
    }